

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

char RegexTree::parse_escape(char c)

{
  undefined1 local_9;
  char c_local;
  
  if (c == 'n') {
    local_9 = '\n';
  }
  else if (c == 'r') {
    local_9 = '\r';
  }
  else {
    local_9 = c;
    if (c == 't') {
      local_9 = '\t';
    }
  }
  return local_9;
}

Assistant:

char RegexTree::parse_escape(char c) {
    switch (c) {
        case 'n':
            return '\n';
        case 't':
            return '\t';
        case 'r':
            return '\r';
        default:
            return c;
    }
}